

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

string * iutest::PrintToString<char[24]>(string *__return_storage_ptr__,char (*v) [24])

{
  iu_global_format_stringstream strm;
  undefined1 auStack_198 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  detail::UniversalTersePrint(*v,(iu_ostream *)(auStack_198 + 0x10));
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToString(const T& v)
{
    iu_global_format_stringstream strm;
    detail::UniversalTersePrint(v, &strm);
    return strm.str();
}